

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_xyz_grad(REF_DBL **xyzs,REF_DBL *scalar,REF_DBL *gradient)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  REF_STATUS RVar6;
  double in_RAX;
  double dVar7;
  REF_DBL RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double local_28;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  local_28 = in_RAX;
  ref_node_xyz_vol(xyzs,&local_28);
  local_28 = local_28 * -6.0;
  pdVar1 = xyzs[3];
  pdVar2 = xyzs[2];
  pdVar3 = *xyzs;
  pdVar4 = xyzs[1];
  dVar12 = *pdVar3;
  dVar13 = pdVar3[1];
  dVar10 = *pdVar1 - dVar12;
  dVar7 = pdVar1[1] - dVar13;
  dVar20 = pdVar3[2];
  dVar19 = pdVar1[2] - dVar20;
  dVar9 = *pdVar2 - dVar12;
  dVar11 = pdVar2[1] - dVar13;
  dVar15 = pdVar2[2] - dVar20;
  dVar12 = *pdVar4 - dVar12;
  dVar13 = pdVar4[1] - dVar13;
  dVar20 = pdVar4[2] - dVar20;
  dVar18 = *scalar;
  auVar14._0_8_ =
       (scalar[3] - dVar18) * (dVar11 * dVar20 - dVar13 * dVar15) +
       (scalar[2] - dVar18) * (dVar13 * dVar19 - dVar7 * dVar20) +
       (scalar[1] - dVar18) * (dVar7 * dVar15 - dVar11 * dVar19);
  *gradient = auVar14._0_8_;
  dVar18 = *scalar;
  dVar18 = (scalar[3] - dVar18) * (dVar15 * dVar12 - dVar20 * dVar9) +
           (scalar[2] - dVar18) * (dVar20 * dVar10 - dVar19 * dVar12) +
           (scalar[1] - dVar18) * (dVar19 * dVar9 - dVar15 * dVar10);
  gradient[1] = dVar18;
  auVar16._0_8_ = local_28 * 1e+20;
  auVar16._8_8_ = auVar14._0_8_;
  auVar17._8_8_ = -auVar14._0_8_;
  auVar17._0_8_ = -auVar16._0_8_;
  auVar17 = maxpd(auVar16,auVar17);
  dVar20 = auVar17._0_8_;
  if (auVar17._8_8_ < dVar20) {
    dVar15 = dVar18;
    if (dVar18 <= -dVar18) {
      dVar15 = -dVar18;
    }
    if (dVar15 < dVar20) {
      dVar15 = *scalar;
      dVar13 = (scalar[3] - dVar15) * (dVar9 * dVar13 - dVar12 * dVar11) +
               (scalar[2] - dVar15) * (dVar7 * dVar12 - dVar10 * dVar13) +
               (scalar[1] - dVar15) * (dVar10 * dVar11 - dVar9 * dVar7);
      dVar12 = dVar13;
      if (dVar13 <= -dVar13) {
        dVar12 = -dVar13;
      }
      if (dVar12 < dVar20) {
        auVar14._8_8_ = dVar18;
        RVar8 = dVar13 / local_28;
        auVar5._8_4_ = SUB84(local_28,0);
        auVar5._0_8_ = local_28;
        auVar5._12_4_ = (int)((ulong)local_28 >> 0x20);
        auVar17 = divpd(auVar14,auVar5);
        *(undefined1 (*) [16])gradient = auVar17;
        RVar6 = 0;
        goto LAB_001710a3;
      }
    }
  }
  *gradient = 0.0;
  gradient[1] = 0.0;
  RVar6 = 4;
  RVar8 = 0.0;
LAB_001710a3:
  gradient[2] = RVar8;
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_grad(REF_DBL *xyzs[4], REF_DBL *scalar,
                                     REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_DBL *xyz0, *xyz1, *xyz2;

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_xyz_vol(xyzs, &vol), "vol");
  vol *= -6.0;

  xyz0 = xyzs[0];
  xyz1 = xyzs[3];
  xyz2 = xyzs[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm1), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[1];
  xyz2 = xyzs[3];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm2), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[2];
  xyz2 = xyzs[1];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm3), "vol");

  gradient[0] = (scalar[1] - scalar[0]) * norm1[0] +
                (scalar[2] - scalar[0]) * norm2[0] +
                (scalar[3] - scalar[0]) * norm3[0];
  gradient[1] = (scalar[1] - scalar[0]) * norm1[1] +
                (scalar[2] - scalar[0]) * norm2[1] +
                (scalar[3] - scalar[0]) * norm3[1];
  gradient[2] = (scalar[1] - scalar[0]) * norm1[2] +
                (scalar[2] - scalar[0]) * norm2[2] +
                (scalar[3] - scalar[0]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}